

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * __thiscall
fmt::v6::internal::float_writer<wchar_t>::prettify<wchar_t*>
          (float_writer<wchar_t> *this,wchar_t *it)

{
  long lVar1;
  long lVar2;
  int iVar3;
  wchar_t *pwVar4;
  int iVar5;
  int *in_RSI;
  long *in_RDI;
  bool bVar6;
  int num_digits_1;
  int num_zeros_3;
  int num_zeros_2;
  int num_digits;
  int num_zeros_1;
  int num_zeros;
  int full_exp;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffad;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  char cVar7;
  int local_44;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  wchar_t *local_18;
  wchar_t *local_8;
  
  iVar5 = (int)in_RDI[1] + *(int *)((long)in_RDI + 0xc);
  if ((char)*(undefined4 *)((long)in_RDI + 0x1c) == '\x01') {
    *in_RSI = (int)*(char *)*in_RDI;
    lVar1 = in_RDI[3];
    lVar2 = in_RDI[1];
    if ((1 < (int)in_RDI[1]) || ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0)) {
      in_RSI[1] = (int)in_RDI[4];
    }
    local_18 = copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                         ((char *)in_RDI,
                          (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                           CONCAT16(in_stack_ffffffffffffffae,
                                                    CONCAT15(in_stack_ffffffffffffffad,
                                                             CONCAT14(in_stack_ffffffffffffffac,
                                                                      in_stack_ffffffffffffffa8)))),
                          (wchar_t *)0x20e8e0);
    if ((0 < (int)lVar1 - (int)lVar2) && ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0)) {
      local_18 = std::fill_n<wchar_t*,int,wchar_t>
                           ((wchar_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                            ,in_stack_ffffffffffffffcc,
                            (wchar_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                           );
    }
    cVar7 = 'E';
    if ((*(uint *)((long)in_RDI + 0x1c) & 0x10000) == 0) {
      cVar7 = 'e';
    }
    *local_18 = (int)cVar7;
    local_8 = write_exponent<wchar_t,wchar_t*>(iVar5 + -1,local_18 + 1);
  }
  else {
    if (iVar5 < (int)in_RDI[1]) {
      if (iVar5 < 1) {
        *in_RSI = 0x30;
        iVar5 = -iVar5;
        local_44 = (int)in_RDI[1];
        if (((local_44 == 0) && (-1 < (int)in_RDI[3])) && ((int)in_RDI[3] < iVar5)) {
          iVar5 = (int)in_RDI[3];
        }
        if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) == 0) {
          while( true ) {
            bVar6 = false;
            if (0 < local_44) {
              bVar6 = *(char *)(*in_RDI + (long)(local_44 + -1)) == '0';
            }
            if (!bVar6) break;
            local_44 = local_44 + -1;
          }
          in_stack_ffffffffffffffac = 0;
        }
        if (((iVar5 != 0) || (local_44 != 0)) ||
           (local_18 = in_RSI + 1, (*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0)) {
          in_RSI[1] = *(wchar_t *)(in_RDI + 4);
          std::fill_n<wchar_t*,int,wchar_t>
                    ((wchar_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc,(wchar_t *)CONCAT44(in_stack_ffffffffffffffc4,iVar5))
          ;
          local_18 = copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                               ((char *)in_RDI,
                                (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                                 CONCAT16(in_stack_ffffffffffffffae,
                                                          CONCAT15(in_stack_ffffffffffffffad,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8)))),(wchar_t *)0x20ed31)
          ;
        }
      }
      else {
        pwVar4 = copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                           ((char *)in_RDI,
                            (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                             CONCAT16(in_stack_ffffffffffffffae,
                                                      CONCAT15(in_stack_ffffffffffffffad,
                                                               CONCAT14(in_stack_ffffffffffffffac,
                                                                        in_stack_ffffffffffffffa8)))
                                            ),(wchar_t *)0x20eab5);
        if ((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) == 0) {
          iVar3 = (int)in_RDI[1];
          while( true ) {
            bVar6 = false;
            if (iVar5 < iVar3) {
              bVar6 = *(char *)(*in_RDI + (long)(iVar3 + -1)) == '0';
            }
            if (!bVar6) break;
            iVar3 = iVar3 + -1;
          }
          if (iVar3 != iVar5) {
            *pwVar4 = *(wchar_t *)(in_RDI + 4);
          }
          pwVar4 = copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                             ((char *)in_RDI,
                              (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                               CONCAT16(in_stack_ffffffffffffffae,
                                                        (uint6)CONCAT14(in_stack_ffffffffffffffac,
                                                                        in_stack_ffffffffffffffa8)))
                              ,(wchar_t *)0x20eb73);
          return pwVar4;
        }
        *pwVar4 = *(wchar_t *)(in_RDI + 4);
        local_18 = copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                             ((char *)in_RDI,
                              (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                               CONCAT16(in_stack_ffffffffffffffae,
                                                        CONCAT15(in_stack_ffffffffffffffad,
                                                                 CONCAT14(in_stack_ffffffffffffffac,
                                                                          in_stack_ffffffffffffffa8)
                                                                ))),(wchar_t *)0x20ebb7);
        if ((int)in_RDI[1] < (int)in_RDI[3]) {
          local_18 = std::fill_n<wchar_t*,int,wchar_t>
                               ((wchar_t *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                in_stack_ffffffffffffffcc,
                                (wchar_t *)CONCAT44(0x30,in_stack_ffffffffffffffc0));
        }
      }
    }
    else {
      copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                ((char *)in_RDI,
                 (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                  CONCAT16(in_stack_ffffffffffffffae,
                                           CONCAT15(in_stack_ffffffffffffffad,
                                                    CONCAT14(in_stack_ffffffffffffffac,
                                                             in_stack_ffffffffffffffa8)))),
                 (wchar_t *)0x20e9ad);
      pwVar4 = std::fill_n<wchar_t*,int,wchar_t>
                         ((wchar_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc,
                          (wchar_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      if (((*(uint *)((long)in_RDI + 0x1c) >> 0x15 & 1) != 0) ||
         (local_18 = pwVar4, (int)in_RDI[3] < 0)) {
        *pwVar4 = *(wchar_t *)(in_RDI + 4);
        iVar5 = (int)in_RDI[3] - iVar5;
        if (iVar5 < 1) {
          local_18 = pwVar4 + 1;
          if ((char)*(undefined4 *)((long)in_RDI + 0x1c) != '\x02') {
            local_18 = pwVar4 + 2;
            pwVar4[1] = L'0';
          }
          return local_18;
        }
        local_18 = std::fill_n<wchar_t*,int,wchar_t>
                             ((wchar_t *)CONCAT44(iVar5,0x30),in_stack_ffffffffffffffcc,
                              (wchar_t *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      }
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }